

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

bool __thiscall soul::heart::PureFunctionCall::mayHaveSideEffects(PureFunctionCall *this)

{
  bool bVar1;
  uint uVar2;
  Expression *pEVar3;
  pool_ref<soul::heart::Expression> local_38;
  pool_ref<soul::heart::Expression> a;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *__range2;
  PureFunctionCall *this_local;
  
  bVar1 = Function::mayHaveSideEffects(this->function);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                       (&this->arguments);
    a.object = (Expression *)
               ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                         (&this->arguments);
    for (; (Expression *)__end2 != a.object; __end2 = __end2 + 1) {
      local_38 = (pool_ref<soul::heart::Expression>)__end2->object;
      pEVar3 = pool_ref<soul::heart::Expression>::operator->(&local_38);
      uVar2 = (*(pEVar3->super_Object)._vptr_Object[10])();
      bVar1 = (uVar2 & 1) != 0;
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      pool_ref<soul::heart::Expression>::~pool_ref(&local_38);
      if (bVar1) goto LAB_004dc074;
    }
    this_local._7_1_ = 0;
  }
LAB_004dc074:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool mayHaveSideEffects() const override
        {
            if (function.mayHaveSideEffects())
                return true;

            for (auto a : arguments)
                if (a->mayHaveSideEffects())
                    return true;

            return false;
        }